

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetOutputFormat_abi_cxx11_(void)

{
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  allocator local_3b;
  byte local_3a;
  allocator local_39;
  char *local_38;
  char *colon;
  allocator local_19;
  char *local_18;
  char *gtest_output_flag;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    local_38 = strchr(local_18,0x3a);
    pcVar1 = local_18;
    local_3a = 0;
    if (local_38 == (char *)0x0) {
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_39);
    }
    else {
      uVar2 = (long)local_38 - (long)local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetOutputFormat() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL) return std::string("");

  const char* const colon = strchr(gtest_output_flag, ':');
  return (colon == NULL) ?
      std::string(gtest_output_flag) :
      std::string(gtest_output_flag, colon - gtest_output_flag);
}